

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O2

long gztell64(gzFile file)

{
  uchar *puVar1;
  
  puVar1 = (uchar *)0xffffffffffffffff;
  if ((file != (gzFile)0x0) && ((file[1].have == 0x79b1 || (file[1].have == 0x1c4f)))) {
    if ((int)file[4].pos == 0) {
      puVar1 = (uchar *)0x0;
    }
    else {
      puVar1 = file[4].next;
    }
    puVar1 = puVar1 + file->pos;
  }
  return (long)puVar1;
}

Assistant:

z_off64_t ZEXPORT gztell64(gzFile file) {
    gz_statep state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return -1;

    /* return position */
    return state->x.pos + (state->seek ? state->skip : 0);
}